

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O3

int32_t lj_lib_checkint(lua_State *L,int narg)

{
  int iVar1;
  TValue *o;
  lua_Number lVar2;
  
  o = L->base + (long)narg + -1;
  if (L->top <= o) {
LAB_001178d5:
    lj_err_argt(L,narg,3);
  }
  lVar2 = o->n;
  if (0xfffffffffffffff2 < (ulong)((long)lVar2 >> 0x2f)) {
    if (((long)lVar2 >> 0x2f != 0xfffffffffffffffb) ||
       (iVar1 = lj_strscan_num((GCstr *)((ulong)lVar2 & 0x7fffffffffff),o), iVar1 == 0))
    goto LAB_001178d5;
    lVar2 = o->n;
  }
  return (int)lVar2;
}

Assistant:

int32_t lj_lib_checkint(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (!(o < L->top && lj_strscan_numberobj(o)))
    lj_err_argt(L, narg, LUA_TNUMBER);
  if (LJ_LIKELY(tvisint(o))) {
    return intV(o);
  } else {
    int32_t i = lj_num2int(numV(o));
    if (LJ_DUALNUM) setintV(o, i);
    return i;
  }
}